

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubeMap.cpp
# Opt level: O1

void __thiscall CubeMap::CubeMap(CubeMap *this,string *directory)

{
  pointer pcVar1;
  void *pvVar2;
  pointer **pppVVar3;
  long *plVar4;
  pointer *ppVVar5;
  size_type *psVar6;
  long lVar7;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string side [6];
  Image local_158;
  string local_138;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  memset(this,0,0xc0);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"left","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"right","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"up","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"down","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"front","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"back","");
  pppVVar3 = (pointer **)
             &local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
              super__Vector_impl_data._M_finish;
  lVar7 = 0;
  do {
    local_118[0] = local_108;
    pcVar1 = (directory->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,pcVar1,pcVar1 + directory->_M_string_length);
    std::__cxx11::string::append((char *)local_118);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_118,*(ulong *)((long)local_f8 + lVar7));
    ppVVar5 = (pointer *)(plVar4 + 2);
    if ((pointer *)*plVar4 == ppVVar5) {
      local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
      super__Vector_impl_data._M_finish = *ppVVar5;
      local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)plVar4[3];
      local_158._0_8_ = pppVVar3;
    }
    else {
      local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
      super__Vector_impl_data._M_finish = *ppVVar5;
      local_158._0_8_ = (pointer *)*plVar4;
    }
    local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)plVar4[1];
    *plVar4 = (long)ppVVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_138.field_2._M_allocated_capacity = *psVar6;
      local_138.field_2._8_8_ = plVar4[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar6;
      local_138._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_138._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((pointer **)local_158._0_8_ != pppVVar3) {
      operator_delete((void *)local_158._0_8_);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0]);
    }
    Image::loadPNG(&local_158,&local_138);
    *(undefined8 *)((long)&this->_images[0]._width + lVar7) = local_158._0_8_;
    pvVar2 = *(void **)((long)&this->_images[0]._data.
                               super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar7);
    *(pointer *)
     ((long)&this->_images[0]._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
             super__Vector_impl_data._M_start + lVar7) =
         local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&this->_images[0]._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar7) =
         local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&this->_images[0]._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar7) =
         local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    if (local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0xc0);
  lVar7 = 0;
  do {
    if (local_48 + lVar7 != *(undefined1 **)((long)local_58 + lVar7)) {
      operator_delete(*(undefined1 **)((long)local_58 + lVar7));
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0xc0);
  return;
}

Assistant:

CubeMap::CubeMap(const std::string &directory) {
    std::string side[6] = {"left", "right", "up", "down", "front", "back"};
    for (int ii = 0; ii < 6; ii++) {
        std::string filename = directory + "/" + side[ii] + ".png";
        _images[ii] = Image::loadPNG(filename);
    }

}